

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_MovePlayer(player_t *player)

{
  double dVar1;
  APlayerPawn *pAVar2;
  msecnode_t *pmVar3;
  DVector2 DVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar9;
  double dVar10;
  double friction;
  double local_b8;
  double local_a8;
  undefined4 local_88;
  double local_70;
  undefined1 local_68 [16];
  DAngle local_58;
  DAngle local_50;
  double local_48;
  double local_40;
  DAngle local_38;
  
  pAVar2 = player->mo;
  if (player->turnticks == '\0') {
    dVar5 = (double)(int)(player->cmd).ucmd.yaw * 0.0054931640625;
  }
  else {
    player->turnticks = player->turnticks + 0xff;
    dVar5 = 20.0;
  }
  (pAVar2->super_AActor).Angles.Yaw.Degrees = dVar5 + (pAVar2->super_AActor).Angles.Yaw.Degrees;
  bVar6 = true;
  if ((((pAVar2->super_AActor).floorz < (pAVar2->super_AActor).__Pos.Z) &&
      (((pAVar2->super_AActor).flags2.Value & 0x800) == 0)) &&
     (((pAVar2->super_AActor).BounceFlags.Value & 0x1000) == 0)) {
    bVar6 = (bool)((byte)((uint)player->cheats >> 0x1e) & 1);
  }
  player->onground = bVar6;
  if ((player->cmd).ucmd.sidemove != 0 || (player->cmd).ucmd.forwardmove != 0) {
    local_a8 = P_GetMoveFactor(&pAVar2->super_AActor,&local_70);
    local_b8 = (double)(~-(ulong)(local_70 < 0.90625) & 0x3fa0000000000000 |
                       -(ulong)(local_70 < 0.90625) & (ulong)local_a8);
    if (((player->onground == false) && (((player->mo->super_AActor).flags.Value & 0x200) == 0)) &&
       ((player->mo->super_AActor).waterlevel == 0)) {
      local_a8 = local_a8 * level.aircontrol;
      local_b8 = local_b8 * level.aircontrol;
    }
    local_40 = (double)(int)(player->cmd).ucmd.forwardmove;
    local_48 = (double)(int)(player->cmd).ucmd.sidemove;
    APlayerPawn::TweakSpeeds(pAVar2,&local_40,&local_48);
    dVar5 = (player->mo->super_AActor).Speed * 0.00390625;
    dVar10 = local_40 * dVar5;
    dVar5 = dVar5 * local_48;
    if ((player->morphTics == 0) || ((player->mo->PlayerFlags & 4) != 0)) {
      dVar1 = player->crouchfactor;
      if ((dVar1 != 1.0) || (NAN(dVar1))) {
        dVar10 = dVar10 * dVar1;
        dVar5 = dVar5 * dVar1;
        local_b8 = local_b8 * dVar1;
      }
    }
    dVar10 = dVar10 * local_a8;
    dVar5 = dVar5 * local_a8;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      local_50.Degrees = (pAVar2->super_AActor).Angles.Yaw.Degrees;
      P_Bob(player,&local_50,(double)(int)(player->cmd).ucmd.forwardmove * local_b8 * 0.00390625,
            true);
      local_58.Degrees = (pAVar2->super_AActor).Angles.Yaw.Degrees;
      P_ForwardThrust(player,&local_58,dVar10);
    }
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar9 = local_b8 * (double)(int)(player->cmd).ucmd.sidemove * 0.00390625;
      dVar1 = FFastTrig::cos(&fasttrig,
                             ((pAVar2->super_AActor).Angles.Yaw.Degrees + -90.0) *
                             11930464.711111112 + 6755399441055744.0);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar1;
      local_68._12_4_ = extraout_XMM0_Dd;
      dVar1 = FFastTrig::sin(&fasttrig,dVar1);
      dVar1 = (player->Vel).Y + dVar9 * dVar1;
      DVar4.Y._0_4_ = SUB84(dVar1,0);
      DVar4.X = (player->Vel).X + dVar9 * (double)local_68._0_8_;
      DVar4.Y._4_4_ = (int)((ulong)dVar1 >> 0x20);
      player->Vel = DVar4;
      local_38.Degrees = (pAVar2->super_AActor).Angles.Yaw.Degrees + -90.0;
      AActor::Thrust(&player->mo->super_AActor,&local_38,dVar5);
    }
    if (debugfile != (FILE *)0x0) {
      uVar8 = 0x70;
      if (((uint)player->cheats >> 0xd & 1) == 0) {
        uVar8 = 0x20;
      }
      pAVar2 = player->mo;
      local_88 = SUB84(dVar5,0);
      fprintf((FILE *)debugfile,"move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [",
              SUB84((pAVar2->super_AActor).__Pos.X,0),SUB84((pAVar2->super_AActor).__Pos.Y,0),
              (pAVar2->super_AActor).__Pos.Z,dVar10,local_88,local_a8._0_4_,local_70,
              (ulong)(uint)((int)((ulong)&player[-0x9192].secretcount >> 5) * 0x3cf3cf3d),uVar8,
              (ulong)(uint)(pAVar2->super_AActor).waterlevel);
      for (pmVar3 = (player->mo->super_AActor).touching_sectorlist; pmVar3 != (msecnode_t *)0x0;
          pmVar3 = pmVar3->m_tnext) {
        fprintf((FILE *)debugfile,"%td ",
                ((long)pmVar3->m_sector - (long)sectors >> 3) * -0xf4898d5f85bb395);
      }
      fwrite("]\n",2,1,(FILE *)debugfile);
    }
    uVar7 = player->cheats;
    if (((-(uint)(dVar10 == 0.0 && dVar5 == 0.0) | uVar7 >> 0xd) & 1) == 0) {
      APlayerPawn::PlayRunning(player->mo);
      uVar7 = player->cheats;
    }
    if ((char)uVar7 < '\0') {
      player->cheats = uVar7 & 0xffffff7f;
      (player->camera).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)player->mo;
    }
  }
  return;
}

Assistant:

void P_MovePlayer (player_t *player)
{
	ticcmd_t *cmd = &player->cmd;
	APlayerPawn *mo = player->mo;

	// [RH] 180-degree turn overrides all other yaws
	if (player->turnticks)
	{
		player->turnticks--;
		mo->Angles.Yaw += (180. / TURN180_TICKS);
	}
	else
	{
		mo->Angles.Yaw += cmd->ucmd.yaw * (360./65536.);
	}

	player->onground = (mo->Z() <= mo->floorz) || (mo->flags2 & MF2_ONMOBJ) || (mo->BounceFlags & BOUNCE_MBF) || (player->cheats & CF_NOCLIP2);

	// killough 10/98:
	//
	// We must apply thrust to the player and bobbing separately, to avoid
	// anomalies. The thrust applied to bobbing is always the same strength on
	// ice, because the player still "works just as hard" to move, while the
	// thrust applied to the movement varies with 'movefactor'.

	if (cmd->ucmd.forwardmove | cmd->ucmd.sidemove)
	{
		double forwardmove, sidemove;
		double bobfactor;
		double friction, movefactor;
		double fm, sm;

		movefactor = P_GetMoveFactor (mo, &friction);
		bobfactor = friction < ORIG_FRICTION ? movefactor : ORIG_FRICTION_FACTOR;
		if (!player->onground && !(player->mo->flags & MF_NOGRAVITY) && !player->mo->waterlevel)
		{
			// [RH] allow very limited movement if not on ground.
			movefactor *= level.aircontrol;
			bobfactor*= level.aircontrol;
		}

		fm = cmd->ucmd.forwardmove;
		sm = cmd->ucmd.sidemove;
		mo->TweakSpeeds (fm, sm);
		fm *= player->mo->Speed / 256;
		sm *= player->mo->Speed / 256;

		// When crouching, speed and bobbing have to be reduced
		if (player->CanCrouch() && player->crouchfactor != 1)
		{
			fm *= player->crouchfactor;
			sm *= player->crouchfactor;
			bobfactor *= player->crouchfactor;
		}

		forwardmove = fm * movefactor * (35 / TICRATE);
		sidemove = sm * movefactor * (35 / TICRATE);

		if (forwardmove)
		{
			P_Bob(player, mo->Angles.Yaw, cmd->ucmd.forwardmove * bobfactor / 256., true);
			P_ForwardThrust(player, mo->Angles.Yaw, forwardmove);
		}
		if (sidemove)
		{
			P_Bob(player, mo->Angles.Yaw - 90, cmd->ucmd.sidemove * bobfactor / 256., false);
			P_SideThrust(player, mo->Angles.Yaw, sidemove);
		}

		if (debugfile)
		{
			fprintf (debugfile, "move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [", int(player-players),
				player->cheats&CF_PREDICTING?'p':' ',
				player->mo->X(), player->mo->Y(), player->mo->Z(),forwardmove, sidemove, movefactor, friction, player->mo->waterlevel);
			msecnode_t *n = player->mo->touching_sectorlist;
			while (n != NULL)
			{
				fprintf (debugfile, "%td ", n->m_sector-sectors);
				n = n->m_tnext;
			}
			fprintf (debugfile, "]\n");
		}

		if (!(player->cheats & CF_PREDICTING) && (forwardmove != 0 || sidemove != 0))
		{
			player->mo->PlayRunning ();
		}

		if (player->cheats & CF_REVERTPLEASE)
		{
			player->cheats &= ~CF_REVERTPLEASE;
			player->camera = player->mo;
		}
	}
}